

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Bitmask exprSelectUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  ExprList *pEVar1;
  SrcList *pSVar2;
  Expr *p;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Bitmask BVar6;
  ulong uVar7;
  Bitmask BVar8;
  ExprList_item *pEVar9;
  long lVar10;
  long lVar11;
  
  if (pS == (Select *)0x0) {
    BVar8 = 0;
  }
  else {
    BVar8 = 0;
    do {
      pEVar1 = pS->pEList;
      pSVar2 = pS->pSrc;
      if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
        uVar7 = 0;
      }
      else {
        pEVar9 = pEVar1->a;
        lVar11 = 0;
        uVar7 = 0;
        do {
          if (pEVar9->pExpr == (Expr *)0x0) {
            uVar3 = 0;
          }
          else {
            uVar3 = sqlite3WhereExprUsageNN(pMaskSet,pEVar9->pExpr);
          }
          uVar7 = uVar7 | uVar3;
          lVar11 = lVar11 + 1;
          pEVar9 = pEVar9 + 1;
        } while (lVar11 < pEVar1->nExpr);
      }
      pEVar1 = pS->pGroupBy;
      if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
        uVar3 = 0;
      }
      else {
        pEVar9 = pEVar1->a;
        lVar11 = 0;
        uVar3 = 0;
        do {
          if (pEVar9->pExpr == (Expr *)0x0) {
            uVar4 = 0;
          }
          else {
            uVar4 = sqlite3WhereExprUsageNN(pMaskSet,pEVar9->pExpr);
          }
          uVar3 = uVar3 | uVar4;
          lVar11 = lVar11 + 1;
          pEVar9 = pEVar9 + 1;
        } while (lVar11 < pEVar1->nExpr);
      }
      pEVar1 = pS->pOrderBy;
      if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
        uVar4 = 0;
      }
      else {
        pEVar9 = pEVar1->a;
        lVar11 = 0;
        uVar4 = 0;
        do {
          if (pEVar9->pExpr == (Expr *)0x0) {
            uVar5 = 0;
          }
          else {
            uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pEVar9->pExpr);
          }
          uVar4 = uVar4 | uVar5;
          lVar11 = lVar11 + 1;
          pEVar9 = pEVar9 + 1;
        } while (lVar11 < pEVar1->nExpr);
      }
      if (pS->pWhere == (Expr *)0x0) {
        BVar6 = 0;
      }
      else {
        BVar6 = sqlite3WhereExprUsageNN(pMaskSet,pS->pWhere);
      }
      if (pS->pHaving == (Expr *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pS->pHaving);
      }
      BVar8 = uVar7 | BVar8 | uVar3 | uVar4 | BVar6 | uVar5;
      if ((pSVar2 != (SrcList *)0x0) && (0 < pSVar2->nSrc)) {
        lVar11 = 0;
        do {
          BVar6 = exprSelectUsage(pMaskSet,pSVar2->a[lVar11].pSelect);
          BVar8 = BVar6 | BVar8;
          if ((pSVar2->a[lVar11].fg.field_0x2 & 4) == 0) {
            p = pSVar2->a[lVar11].u3.pOn;
            if (p == (Expr *)0x0) {
              uVar7 = 0;
            }
            else {
              uVar7 = sqlite3WhereExprUsageNN(pMaskSet,p);
            }
            BVar8 = BVar8 | uVar7;
          }
          if ((pSVar2->a[lVar11].fg.field_0x1 & 4) != 0) {
            pEVar1 = pSVar2->a[lVar11].u1.pFuncArg;
            if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
              uVar7 = 0;
            }
            else {
              pEVar9 = pEVar1->a;
              lVar10 = 0;
              uVar7 = 0;
              do {
                if (pEVar9->pExpr == (Expr *)0x0) {
                  uVar3 = 0;
                }
                else {
                  uVar3 = sqlite3WhereExprUsageNN(pMaskSet,pEVar9->pExpr);
                }
                uVar7 = uVar7 | uVar3;
                lVar10 = lVar10 + 1;
                pEVar9 = pEVar9 + 1;
              } while (lVar10 < pEVar1->nExpr);
            }
            BVar8 = BVar8 | uVar7;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < pSVar2->nSrc);
      }
      pS = pS->pPrior;
    } while (pS != (Select *)0x0);
  }
  return BVar8;
}

Assistant:

static Bitmask exprSelectUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pEList);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pGroupBy);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pWhere);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        mask |= exprSelectUsage(pMaskSet, pSrc->a[i].pSelect);
        if( pSrc->a[i].fg.isUsing==0 ){
          mask |= sqlite3WhereExprUsage(pMaskSet, pSrc->a[i].u3.pOn);
        }
        if( pSrc->a[i].fg.isTabFunc ){
          mask |= sqlite3WhereExprListUsage(pMaskSet, pSrc->a[i].u1.pFuncArg);
        }
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}